

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(void)

{
  undefined4 in_EAX;
  pal_result pVar1;
  char *pcVar2;
  unsigned_short temperature;
  unsigned_short local_6;
  float local_4;
  
  local_6 = (unsigned_short)((uint)in_EAX >> 0x10);
  pVar1 = pal_temperature_get(&local_6);
  if (pVar1 != PAL_OK) {
    return pVar1;
  }
  local_4 = pal_temperature_to_celsius(local_6);
  pcVar2 = pal_version_get_string();
  printf("My current PAL version is %s\r\n",pcVar2);
  printf("My current temperature is %.1fc\r\n",(double)local_4);
  do {
    temperature_monitor();
    pal_sleep(1000);
  } while( true );
}

Assistant:

int main()
{
    unsigned short temperature;

    pal_result result = pal_temperature_get(&temperature);
    if (result != PAL_OK) return (int)result;

    float t_c = pal_temperature_to_celsius(temperature);

    printf("My current PAL version is %s\r\n", pal_version_get_string());

    printf("My current temperature is %.1fc\r\n", t_c);

    while (1) {
        temperature_monitor();
        pal_sleep(1000);
    }

    return 0;
}